

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeSymbol.cpp
# Opt level: O1

span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> __thiscall
slang::ast::AttributeSymbol::fromSyntax
          (AttributeSymbol *this,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax,
          Scope *scope,Symbol *symbol)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> this_00;
  Compilation **ppCVar1;
  long lVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  Symbol *pSVar9;
  BumpAllocator *pBVar10;
  size_t sVar11;
  int iVar12;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar13;
  ConstantValue *args_2;
  uint64_t uVar14;
  Diagnostic *this_01;
  undefined4 extraout_var;
  uint uVar16;
  long lVar17;
  __extent_storage<18446744073709551615UL> _Var18;
  __extent_storage<18446744073709551615UL> _Var19;
  Scope *extraout_RDX;
  Scope *pSVar20;
  Scope *extraout_RDX_00;
  Scope *extraout_RDX_01;
  size_t extraout_RDX_02;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  size_t *psVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  string_view sVar34;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar35;
  try_emplace_args_t local_211;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_210;
  uint local_208;
  undefined2 local_204;
  string_view name;
  AttributeSymbol *attr;
  ulong local_1e8;
  uint64_t local_1e0;
  size_t *local_1d8;
  size_t *local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  long local_1b0;
  Scope *local_1a8;
  BumpAllocator *local_1a0;
  char *local_198;
  ConstantValue value;
  SmallVector<const_slang::ast::AttributeSymbol_*,_5UL> attrs;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
  nameMap;
  pointer ppAVar15;
  
  _Var18 = syntax._M_extent._M_extent_value;
  if (syntax._M_ptr == (pointer)0x0) {
    _Var18._M_extent_value = 0;
    ppAVar15 = (pointer)0x0;
  }
  else {
    nameMap.super_Storage.ptr = (char *)&nameMap;
    nameMap._112_8_ = 0x3f;
    nameMap._120_8_ = 1;
    nameMap._128_16_ = ZEXT816(0x516460);
    nameMap._144_8_ = 0;
    nameMap._152_8_ = 0;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ =
         (pointer)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.firstElement;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len = 0;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.cap = 5;
    local_1a0 = *(BumpAllocator **)_Var18._M_extent_value;
    pSVar9 = &this->super_Symbol;
    pBVar10 = local_1a0 + 0xd;
    _Var19._M_extent_value = _Var18._M_extent_value;
    nameMap.super_Storage._104_8_ = nameMap.super_Storage.ptr;
    do {
      lVar2 = *(long *)&this->super_Symbol;
      uVar29 = *(long *)(lVar2 + 0x68) + 1;
      if (1 < uVar29) {
        uVar30 = 0;
        do {
          ppSVar13 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )(uVar30 * 0x30 + *(long *)(lVar2 + 0x60)));
          pSVar3 = *ppSVar13;
          this_00 = pSVar3 + 1;
          sVar34 = parsing::Token::valueText((Token *)this_00);
          _Var19._M_extent_value = (size_t)sVar34._M_str;
          name = sVar34;
          if (sVar34._M_len != 0) {
            if (pSVar3[1].previewNode == (SyntaxNode *)0x0) {
              local_208 = 1;
              local_204 = 0;
              local_210.val = 1;
              SVInt::clearUnusedBits((SVInt *)&local_210);
              auVar32 = value.value.
                        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        ._M_u._M_rest._0_16_;
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._0_8_ = local_210;
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._12_1_ = (undefined1)local_204;
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._8_4_ = local_208;
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._14_2_ = auVar32._14_2_;
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._13_1_ = local_204._1_1_;
              if (0x40 < local_208 || (local_204 & 0x100) != 0) {
                local_210.val = 0;
              }
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_index = '\x01';
              if ((0x40 < local_208 || (local_204 & 0x100) != 0) &&
                 ((void *)local_210.val != (void *)0x0)) {
                operator_delete__(local_210.pVal);
              }
              local_210 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                          parsing::Token::location((Token *)this_00);
              args_2 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                                 ((TypedBumpAllocator<slang::ConstantValue> *)&pBVar10->endPtr,
                                  &value);
              attr = BumpAllocator::
                     emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ConstantValue&>
                               (local_1a0,&name,(SourceLocation *)&local_210,args_2);
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&value);
            }
            else {
              local_210 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                          parsing::Token::location((Token *)this_00);
              value.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_u._M_rest._0_16_ = (undefined1  [16])(undefined1  [16])sVar34;
              attr = BumpAllocator::
                     emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax&>
                               (local_1a0,(basic_string_view<char,_std::char_traits<char>_> *)&value
                                ,(SourceLocation *)&local_210,(Symbol *)scope,
                                (ExpressionSyntax *)pSVar3[1].previewNode[1].previewNode);
            }
            (attr->super_Symbol).originatingSyntax = pSVar3;
            uVar14 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )&nameMap.super_Storage.field_0x68,&name);
            uVar21 = uVar14 >> (nameMap._112_1_ & 0x3f);
            lVar17 = (uVar14 & 0xff) * 4;
            cVar5 = (&UNK_0051605c)[lVar17];
            cVar6 = (&UNK_0051605d)[lVar17];
            cVar7 = (&UNK_0051605e)[lVar17];
            cVar8 = (&UNK_0051605f)[lVar17];
            sVar11 = name._M_len;
            local_198 = name._M_str;
            uVar14 = (uint64_t)((uint)uVar14 & 7);
            uVar23 = 0;
            lVar17 = nameMap._136_8_;
            pSVar20 = (Scope *)nameMap._128_8_;
            uVar22 = nameMap._120_8_;
            do {
              ppCVar1 = &pSVar20->compilation + uVar21 * 2;
              auVar32[0] = -(*(char *)ppCVar1 == cVar5);
              auVar32[1] = -(*(char *)((long)ppCVar1 + 1) == cVar6);
              auVar32[2] = -(*(char *)((long)ppCVar1 + 2) == cVar7);
              auVar32[3] = -(*(char *)((long)ppCVar1 + 3) == cVar8);
              auVar32[4] = -(*(char *)((long)ppCVar1 + 4) == cVar5);
              auVar32[5] = -(*(char *)((long)ppCVar1 + 5) == cVar6);
              auVar32[6] = -(*(char *)((long)ppCVar1 + 6) == cVar7);
              auVar32[7] = -(*(char *)((long)ppCVar1 + 7) == cVar8);
              auVar32[8] = -(*(char *)(ppCVar1 + 1) == cVar5);
              auVar32[9] = -(*(char *)((long)ppCVar1 + 9) == cVar6);
              auVar32[10] = -(*(char *)((long)ppCVar1 + 10) == cVar7);
              auVar32[0xb] = -(*(char *)((long)ppCVar1 + 0xb) == cVar8);
              auVar32[0xc] = -(*(char *)((long)ppCVar1 + 0xc) == cVar5);
              auVar32[0xd] = -(*(char *)((long)ppCVar1 + 0xd) == cVar6);
              auVar32[0xe] = -(*(char *)((long)ppCVar1 + 0xe) == cVar7);
              auVar32[0xf] = -(*(char *)((long)ppCVar1 + 0xf) == cVar8);
              uVar16 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe);
              uVar26 = uVar23;
              uVar27 = uVar21 * 0x10;
              if (uVar16 != 0) {
                lVar25 = lVar17 + uVar21 * 0x168;
                local_1e8 = uVar21;
                local_1e0 = uVar14;
                local_1c8 = uVar21 * 0x10;
                local_1c0 = uVar23;
                local_1b8 = uVar22;
                local_1b0 = lVar17;
                local_1a8 = pSVar20;
                do {
                  uVar4 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                    }
                  }
                  psVar28 = (size_t *)((ulong)uVar4 * 0x18 + lVar25);
                  bVar31 = sVar11 == *psVar28;
                  if ((sVar11 != 0) && (sVar11 == *psVar28)) {
                    iVar12 = bcmp(local_198,(void *)psVar28[1],sVar11);
                    bVar31 = iVar12 == 0;
                  }
                  if (bVar31) goto LAB_004cf021;
                  uVar16 = uVar16 - 1 & uVar16;
                  lVar17 = local_1b0;
                  uVar14 = local_1e0;
                  uVar21 = local_1e8;
                  pSVar20 = local_1a8;
                  uVar22 = local_1b8;
                  uVar26 = local_1c0;
                  uVar27 = local_1c8;
                } while (uVar16 != 0);
              }
              if ((*(byte *)((long)&pSVar20->thisSym + uVar27 + 7) &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[uVar14]) == 0) break;
              uVar23 = uVar26 + 1;
              uVar21 = uVar21 + uVar26 + 1 & uVar22;
            } while (uVar23 <= uVar22);
            local_1d8 = (size_t *)0x0;
            psVar28 = local_1d8;
LAB_004cf021:
            local_1d8 = psVar28;
            if (local_1d8 == (size_t *)0x0) {
              SmallVectorBase<slang::ast::AttributeSymbol_const*>::
              emplace_back<slang::ast::AttributeSymbol_const*const&>
                        ((SmallVectorBase<slang::ast::AttributeSymbol_const*> *)&attrs,&attr);
              local_210.pVal =
                   (uint64_t *)
                   (attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len - 1);
              uVar14 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)&nameMap.super_Storage.field_0x68,&name);
              uVar23 = uVar14 >> (nameMap._112_1_ & 0x3f);
              lVar17 = (uVar14 & 0xff) * 4;
              cVar5 = (&UNK_0051605c)[lVar17];
              cVar6 = (&UNK_0051605d)[lVar17];
              cVar7 = (&UNK_0051605e)[lVar17];
              cVar8 = (&UNK_0051605f)[lVar17];
              sVar11 = name._M_len;
              local_198 = name._M_str;
              uVar21 = (ulong)((uint)uVar14 & 7);
              uVar27 = 0;
              lVar17 = nameMap._136_8_;
              _Var19._M_extent_value = nameMap._128_8_;
              uVar22 = nameMap._120_8_;
              uVar26 = uVar23;
              do {
                ppCVar1 = &((Scope *)_Var19._M_extent_value)->compilation + uVar26 * 2;
                auVar33[0] = -(*(char *)ppCVar1 == cVar5);
                auVar33[1] = -(*(char *)((long)ppCVar1 + 1) == cVar6);
                auVar33[2] = -(*(char *)((long)ppCVar1 + 2) == cVar7);
                auVar33[3] = -(*(char *)((long)ppCVar1 + 3) == cVar8);
                auVar33[4] = -(*(char *)((long)ppCVar1 + 4) == cVar5);
                auVar33[5] = -(*(char *)((long)ppCVar1 + 5) == cVar6);
                auVar33[6] = -(*(char *)((long)ppCVar1 + 6) == cVar7);
                auVar33[7] = -(*(char *)((long)ppCVar1 + 7) == cVar8);
                auVar33[8] = -(*(char *)(ppCVar1 + 1) == cVar5);
                auVar33[9] = -(*(char *)((long)ppCVar1 + 9) == cVar6);
                auVar33[10] = -(*(char *)((long)ppCVar1 + 10) == cVar7);
                auVar33[0xb] = -(*(char *)((long)ppCVar1 + 0xb) == cVar8);
                auVar33[0xc] = -(*(char *)((long)ppCVar1 + 0xc) == cVar5);
                auVar33[0xd] = -(*(char *)((long)ppCVar1 + 0xd) == cVar6);
                auVar33[0xe] = -(*(char *)((long)ppCVar1 + 0xe) == cVar7);
                auVar33[0xf] = -(*(char *)((long)ppCVar1 + 0xf) == cVar8);
                uVar16 = (uint)(ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe);
                pSVar20 = (Scope *)_Var19._M_extent_value;
                uVar24 = uVar26;
                if (uVar16 != 0) {
                  lVar25 = lVar17 + uVar26 * 0x168;
                  local_1e8 = uVar23;
                  local_1e0 = uVar14;
                  local_1c8 = uVar26;
                  local_1c0 = uVar22;
                  local_1b8 = uVar21;
                  local_1b0 = lVar17;
                  local_1a8 = (Scope *)_Var19._M_extent_value;
                  do {
                    uVar4 = 0;
                    if (uVar16 != 0) {
                      for (; (uVar16 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                      }
                    }
                    psVar28 = (size_t *)(lVar25 + (ulong)uVar4 * 0x18);
                    bVar31 = sVar11 == *psVar28;
                    if ((sVar11 != 0) && (sVar11 == *psVar28)) {
                      iVar12 = bcmp(local_198,(void *)psVar28[1],sVar11);
                      bVar31 = iVar12 == 0;
                      _Var19._M_extent_value = (size_t)extraout_RDX;
                    }
                    uVar14 = local_1e0;
                    uVar23 = local_1e8;
                    if (bVar31) goto LAB_004cf24d;
                    uVar16 = uVar16 - 1 & uVar16;
                    lVar17 = local_1b0;
                    pSVar20 = local_1a8;
                    uVar21 = local_1b8;
                    uVar22 = local_1c0;
                    uVar24 = local_1c8;
                  } while (uVar16 != 0);
                }
                _Var19._M_extent_value = (size_t)pSVar20;
                if ((*(byte *)((long)&pSVar20->thisSym + uVar26 * 0x10 + 7) &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[uVar21]) == 0) break;
                lVar25 = uVar24 + uVar27;
                uVar27 = uVar27 + 1;
                uVar26 = lVar25 + 1U & uVar22;
              } while (uVar27 <= uVar22);
              local_1d0 = (size_t *)0x0;
              psVar28 = local_1d0;
LAB_004cf24d:
              local_1d0 = psVar28;
              if (local_1d0 == (size_t *)0x0) {
                if ((ulong)nameMap._152_8_ < (ulong)nameMap._144_8_) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                            ((locator *)&value,
                             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                              *)&nameMap.super_Storage.field_0x68,(arrays_type *)&nameMap.field_0x70
                             ,uVar23,uVar14,&local_211,&name,&local_210.val);
                  nameMap._152_8_ = nameMap._152_8_ + 1;
                  _Var19._M_extent_value = (size_t)extraout_RDX_00;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                            ((locator *)&value,
                             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                              *)&nameMap.super_Storage.field_0x68,uVar14,&local_211,&name,
                             &local_210.val);
                  _Var19._M_extent_value = (size_t)extraout_RDX_01;
                }
              }
            }
            else {
              this_01 = Scope::addDiag((Scope *)_Var18._M_extent_value,(DiagCode)0xed0006,
                                       (attr->super_Symbol).location);
              Diagnostic::operator<<(this_01,name);
              attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_[local_1d8[2]] =
                   attr;
              _Var19._M_extent_value =
                   (size_t)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_;
            }
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar29 >> 1);
      }
      this = (AttributeSymbol *)&(this->super_Symbol).name;
    } while (this != (AttributeSymbol *)(&pSVar9->kind + (long)syntax._M_ptr * 2));
    iVar12 = SmallVectorBase<const_slang::ast::AttributeSymbol_*>::copy
                       (&attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>,
                        (EVP_PKEY_CTX *)local_1a0,(EVP_PKEY_CTX *)_Var19._M_extent_value);
    ppAVar15 = (pointer)CONCAT44(extraout_var,iVar12);
    if (attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ !=
        (pointer)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.firstElement) {
      operator_delete(attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_);
    }
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ =
         (pointer)nameMap.super_Storage._104_8_;
    _Var18._M_extent_value = extraout_RDX_02;
    if (nameMap._136_8_ != 0) {
      slang::detail::hashing::
      StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
      ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
                    *)&attrs,
                   (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                    *)nameMap._136_8_,(nameMap._120_8_ * 0x178 + 0x186U) / 0x18);
    }
  }
  sVar35._M_extent._M_extent_value = _Var18._M_extent_value;
  sVar35._M_ptr = ppAVar15;
  return sVar35;
}

Assistant:

std::span<const AttributeSymbol* const> AttributeSymbol::fromSyntax(
    std::span<const AttributeInstanceSyntax* const> syntax, const Scope& scope,
    const Symbol& symbol) {

    if (syntax.empty())
        return {};

    return createAttributes(
        syntax, scope, [&symbol](auto& comp, auto name, auto loc, auto& exprSyntax) {
            return comp.template emplace<AttributeSymbol>(name, loc, symbol, exprSyntax);
        });
}